

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_tests.c
# Opt level: O1

char * AllUpper(char *arr)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  
  sVar2 = strlen(arr);
  pcVar3 = (char *)operator_new__(sVar2 + 1);
  if (sVar2 != 0) {
    sVar4 = 0;
    do {
      if (arr[sVar4] == '\0') break;
      iVar1 = toupper((int)arr[sVar4]);
      pcVar3[sVar4] = (char)iVar1;
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  pcVar3[sVar2] = '\0';
  return pcVar3;
}

Assistant:

char* AllUpper(char* arr)
{
	auto len = strlen(arr);
	char* res = new char[len + 1];
	for(auto i = 0; i < len; i++)
	{
		if(arr[i] == '\0')
			break;
		res[i] = toupper(arr[i]);
	}
	res[len] = 0;
	return res;
}